

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O2

void __thiscall mp::NameProvider::NameProvider(NameProvider *this,CStringRef gen_name,CStringRef n2)

{
  allocator<char> local_1a;
  allocator<char> local_19;
  
  (this->names_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->names_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->gen_name_,gen_name.data_,&local_19);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->gen_name_2_,n2.data_,&local_1a);
  (this->reader_).mapped_file_.super_MemoryMappedFileBase.start_ = (char *)0x0;
  (this->reader_).mapped_file_.super_MemoryMappedFileBase.size_ = 0;
  (this->writer_).super_BasicWriter<char>.buffer_ = &(this->writer_).buffer_.super_Buffer<char>;
  (this->writer_).super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_0025b1f8;
  (this->writer_).buffer_.super_Buffer<char>.ptr_ = (this->writer_).buffer_.data_;
  (this->writer_).buffer_.super_Buffer<char>.size_ = 0;
  (this->writer_).buffer_.super_Buffer<char>.capacity_ = 500;
  (this->writer_).buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0025b240;
  return;
}

Assistant:

mp::NameProvider::NameProvider(
    fmt::CStringRef gen_name, fmt::CStringRef n2)
  : gen_name_(gen_name.c_str()), gen_name_2_(n2.c_str()) { }